

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O2

void vkt::FragmentOperations::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  TestPrimitive TVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  char *pcVar5;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [40];
  ostringstream src;
  
  TVar1 = caseDef->primitive;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  vec4 in_position;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 1) in  vec4 in_color;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 o_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"out gl_PerVertex {\n");
  poVar3 = std::operator<<(poVar3,"    vec4  gl_Position;\n");
  pcVar2 = "    float gl_PointSize;\n";
  pcVar5 = "";
  if (TVar1 != TEST_PRIMITIVE_POINTS) {
    pcVar2 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,"};\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    gl_Position  = in_position;\n");
  if (TVar1 == TEST_PRIMITIVE_POINTS) {
    pcVar5 = "    gl_PointSize = 1.0;\n";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,"    o_color      = in_color;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"vert",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  vec4 in_color;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out vec4 o_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    o_color = in_color;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"frag",&local_1f9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	DE_UNREF(caseDef);

	// Vertex shader
	{
		const bool usePointSize = (caseDef.primitive == TEST_PRIMITIVE_POINTS);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4  gl_Position;\n"
			<< (usePointSize ? "    float gl_PointSize;\n" : "")
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position  = in_position;\n"
			<< (usePointSize ? "    gl_PointSize = 1.0;\n" : "")
			<< "    o_color      = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}